

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

int __thiscall
curlpp::FormParts::Content::clone
          (Content *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Content *this_00;
  
  this_00 = (Content *)operator_new(0x68);
  Content(this_00,this);
  return (int)this_00;
}

Assistant:

curlpp::FormParts::Content *
curlpp::FormParts::Content::clone() const
{
   return new curlpp::FormParts::Content(*this);
}